

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.hpp
# Opt level: O0

char * memory::impl::aligned_malloc<char,8ul>(size_type size)

{
  int iVar1;
  void *pvStack_20;
  int result;
  void *ptr;
  size_type size_local;
  
  ptr = (void *)size;
  iVar1 = posix_memalign(&stack0xffffffffffffffe0,8,size);
  if (iVar1 == 0) {
    size_local = (size_type)pvStack_20;
  }
  else {
    size_local = 0;
  }
  return (char *)size_local;
}

Assistant:

T* aligned_malloc(size_type size) {
        // double check that alignment is a multiple of sizeof(void*),
        // which is a prerequisite for posix_memalign()
        static_assert( !(alignment%sizeof(void*)),
                "alignment is not a multiple of sizeof(void*)");
        static_assert( is_power_of_two(alignment),
                "alignment is not a power of two");
        void *ptr;
        int result = posix_memalign(&ptr, alignment, size*sizeof(T));
        if(result) {
            return nullptr;
        }
        return reinterpret_cast<T*>(ptr);
    }